

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O1

int stbi_write_hdr_core(stbi__write_context *s,int x,int y,int comp,float *data)

{
  int iVar1;
  uchar *scratch;
  long lVar2;
  ulong uVar3;
  char *pcVar4;
  undefined8 *puVar5;
  int iVar6;
  byte bVar7;
  char buffer [128];
  char header [66];
  char local_f8 [128];
  undefined8 local_78 [8];
  undefined2 local_38;
  
  bVar7 = 0;
  iVar1 = 0;
  if (data != (float *)0x0 && (0 < x && 0 < y)) {
    scratch = (uchar *)malloc((ulong)(uint)(x * 4));
    pcVar4 = "#?RADIANCE\n# Written by stb_image_write.h\nFORMAT=32-bit_rle_rgbe\n";
    puVar5 = local_78;
    for (lVar2 = 8; lVar2 != 0; lVar2 = lVar2 + -1) {
      *puVar5 = *(undefined8 *)pcVar4;
      pcVar4 = pcVar4 + ((ulong)bVar7 * -2 + 1) * 8;
      puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
    }
    local_38 = 10;
    (*s->func)(s->context,local_78,0x41);
    iVar6 = 0;
    iVar1 = sprintf(local_f8,"EXPOSURE=          1.0000000000000\n\n-Y %d +X %d\n",(ulong)(uint)y,
                    (ulong)(uint)x);
    (*s->func)(s->context,local_f8,iVar1);
    uVar3 = (ulong)(uint)y;
    do {
      stbiw__write_hdr_scanline(s,x,comp,scratch,data + iVar6);
      iVar6 = iVar6 + comp * x;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
    free(scratch);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int stbi_write_hdr_core(stbi__write_context *s, int x, int y, int comp, float *data)
{
   if (y <= 0 || x <= 0 || data == NULL)
      return 0;
   else {
      // Each component is stored separately. Allocate scratch space for full output scanline.
      unsigned char *scratch = (unsigned char *) STBIW_MALLOC(x*4);
      int i, len;
      char buffer[128];
      char header[] = "#?RADIANCE\n# Written by stb_image_write.h\nFORMAT=32-bit_rle_rgbe\n";
      s->func(s->context, header, sizeof(header)-1);

      len = sprintf(buffer, "EXPOSURE=          1.0000000000000\n\n-Y %d +X %d\n", y, x);
      s->func(s->context, buffer, len);

      for(i=0; i < y; i++)
         stbiw__write_hdr_scanline(s, x, comp, scratch, data + comp*i*x);
      STBIW_FREE(scratch);
      return 1;
   }
}